

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O0

void build_state_scanner(Grammar *g,LexState *ls,State *s)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  NFAState **ppNVar4;
  long lVar5;
  bool bVar6;
  Action *pAVar7;
  NFAState *pNVar8;
  int iVar9;
  int iVar10;
  anon_struct_40_4_d8687ec6 *paVar11;
  ushort **ppuVar12;
  NFAState *pNVar13;
  NFAState *pNVar14;
  NFAState *pNVar15;
  anon_struct_40_4_d8687ec6_for_epsilon *v;
  Action *trailing_context;
  uint one;
  uint j;
  uint8 *reg;
  uint8 *c;
  Action *a;
  NFAState *nnn;
  NFAState *nn;
  NFAState *n;
  State *s_local;
  LexState *ls_local;
  Grammar *g_local;
  
  bVar6 = false;
  n = (NFAState *)s;
  s_local = (State *)ls;
  ls_local = (LexState *)g;
  nn = new_NFAState(ls);
  for (trailing_context._4_4_ = 0; trailing_context._4_4_ < *(uint *)&n->chars[3].v;
      trailing_context._4_4_ = trailing_context._4_4_ + 1) {
    c = (uint8 *)n->chars[3].e[0]->chars[0].e[(ulong)trailing_context._4_4_ - 3];
    if (((NFAState *)c)->index == 0) {
      bVar6 = true;
      if (nn->chars[0].n == 0) {
        if (nn->chars[0].v == (NFAState **)0x0) {
          a = (Action *)new_NFAState((LexState *)s_local);
          nn->chars[0].v = nn->chars[0].e;
          uVar2 = nn->chars[0].n;
          nn->chars[0].n = uVar2 + 1;
          nn->chars[0].e[uVar2] = (NFAState *)a;
        }
        else if (nn->chars[0].v == nn->chars[0].e) {
          if (nn->chars[0].n < 3) {
            a = (Action *)new_NFAState((LexState *)s_local);
            uVar2 = nn->chars[0].n;
            nn->chars[0].n = uVar2 + 1;
            nn->chars[0].v[uVar2] = (NFAState *)a;
          }
          else {
LAB_001455a2:
            paVar11 = nn->chars;
            a = (Action *)new_NFAState((LexState *)s_local);
            vec_add_internal(paVar11,a);
          }
        }
        else {
          if ((nn->chars[0].n & 7) == 0) goto LAB_001455a2;
          a = (Action *)new_NFAState((LexState *)s_local);
          uVar2 = nn->chars[0].n;
          nn->chars[0].n = uVar2 + 1;
          nn->chars[0].v[uVar2] = (NFAState *)a;
        }
      }
      else {
        a = (Action *)*nn->chars[0].v;
      }
      if (a[0xd6].state == (State *)0x0) {
        a[0xd6].state = (State *)&a[0xd6].index;
        uVar2 = *(uint *)&a[0xd6].rule;
        *(uint *)&a[0xd6].rule = uVar2 + 1;
        *(uint8 **)(&a[0xd6].index + (ulong)uVar2 * 2) = c;
      }
      else if (a[0xd6].state == (State *)&a[0xd6].index) {
        if (*(uint *)&a[0xd6].rule < 3) {
          uVar2 = *(uint *)&a[0xd6].rule;
          *(uint *)&a[0xd6].rule = uVar2 + 1;
          ((a[0xd6].state)->items).e[(ulong)uVar2 - 4] = (Item *)c;
        }
        else {
LAB_001456c9:
          vec_add_internal(&a[0xd6].rule,c);
        }
      }
      else {
        if (((ulong)a[0xd6].rule & 7) == 0) goto LAB_001456c9;
        uVar2 = *(uint *)&a[0xd6].rule;
        *(uint *)&a[0xd6].rule = uVar2 + 1;
        ((a[0xd6].state)->items).e[(ulong)uVar2 - 4] = (Item *)c;
      }
    }
    else if ((((NFAState *)c)->index == 1) && (**(int **)((NFAState *)c)->chars == 0)) {
      bVar6 = true;
      nnn = nn;
      if ((*(byte *)(*(long *)((NFAState *)c)->chars + 0x2c) >> 3 & 1) == 0) {
        for (reg = *(uint8 **)(*(long *)((NFAState *)c)->chars + 0x20); *reg != '\0'; reg = reg + 1)
        {
          if (nnn->chars[*reg].n == 0) {
            if (nnn->chars[*reg].v == (NFAState **)0x0) {
              a = (Action *)new_NFAState((LexState *)s_local);
              bVar1 = *reg;
              nnn->chars[*reg].v = nnn->chars[bVar1].e;
              uVar2 = nnn->chars[*reg].n;
              nnn->chars[*reg].n = uVar2 + 1;
              nnn->chars[bVar1].e[uVar2] = (NFAState *)a;
            }
            else if (nnn->chars[*reg].v == nnn->chars[*reg].e) {
              if (nnn->chars[*reg].n < 3) {
                a = (Action *)new_NFAState((LexState *)s_local);
                ppNVar4 = nnn->chars[*reg].v;
                uVar2 = nnn->chars[*reg].n;
                nnn->chars[*reg].n = uVar2 + 1;
                ppNVar4[uVar2] = (NFAState *)a;
              }
              else {
LAB_00145917:
                bVar1 = *reg;
                paVar11 = nnn->chars;
                a = (Action *)new_NFAState((LexState *)s_local);
                vec_add_internal(paVar11 + bVar1,a);
              }
            }
            else {
              if ((nnn->chars[*reg].n & 7) == 0) goto LAB_00145917;
              a = (Action *)new_NFAState((LexState *)s_local);
              ppNVar4 = nnn->chars[*reg].v;
              uVar2 = nnn->chars[*reg].n;
              nnn->chars[*reg].n = uVar2 + 1;
              ppNVar4[uVar2] = (NFAState *)a;
            }
          }
          else {
            a = (Action *)*nnn->chars[*reg].v;
          }
          nnn = (NFAState *)a;
        }
      }
      else {
        for (reg = *(uint8 **)(*(long *)((NFAState *)c)->chars + 0x20); *reg != '\0'; reg = reg + 1)
        {
          ppuVar12 = __ctype_b_loc();
          pNVar15 = nnn;
          if (((*ppuVar12)[(int)(uint)*reg] & 0x400) == 0) {
            if (nnn->chars[*reg].v == (NFAState **)0x0) {
              a = (Action *)new_NFAState((LexState *)s_local);
              bVar1 = *reg;
              nnn->chars[*reg].v = nnn->chars[bVar1].e;
              uVar2 = nnn->chars[*reg].n;
              nnn->chars[*reg].n = uVar2 + 1;
              nnn->chars[bVar1].e[uVar2] = (NFAState *)a;
            }
            else if (nnn->chars[*reg].v == nnn->chars[*reg].e) {
              if (nnn->chars[*reg].n < 3) {
                a = (Action *)new_NFAState((LexState *)s_local);
                ppNVar4 = nnn->chars[*reg].v;
                uVar2 = nnn->chars[*reg].n;
                nnn->chars[*reg].n = uVar2 + 1;
                ppNVar4[uVar2] = (NFAState *)a;
              }
              else {
LAB_00146267:
                bVar1 = *reg;
                paVar11 = nnn->chars;
                a = (Action *)new_NFAState((LexState *)s_local);
                vec_add_internal(paVar11 + bVar1,a);
              }
            }
            else {
              if ((nnn->chars[*reg].n & 7) == 0) goto LAB_00146267;
              a = (Action *)new_NFAState((LexState *)s_local);
              ppNVar4 = nnn->chars[*reg].v;
              uVar2 = nnn->chars[*reg].n;
              nnn->chars[*reg].n = uVar2 + 1;
              ppNVar4[uVar2] = (NFAState *)a;
            }
          }
          else {
            iVar9 = toupper((uint)*reg);
            pNVar8 = nnn;
            if (pNVar15->chars[iVar9].v == (NFAState **)0x0) {
              pNVar13 = new_NFAState((LexState *)s_local);
              pNVar15 = nnn;
              a = (Action *)pNVar13;
              iVar9 = toupper((uint)*reg);
              pNVar8 = nnn;
              iVar10 = toupper((uint)*reg);
              pNVar14 = nnn;
              pNVar8->chars[iVar10].v = pNVar15->chars[iVar9].e;
              iVar10 = toupper((uint)*reg);
              uVar2 = pNVar14->chars[iVar10].n;
              pNVar14->chars[iVar10].n = uVar2 + 1;
              pNVar15->chars[iVar9].e[uVar2] = pNVar13;
            }
            else {
              iVar9 = toupper((uint)*reg);
              pNVar15 = nnn;
              ppNVar4 = pNVar8->chars[iVar9].v;
              iVar9 = toupper((uint)*reg);
              pNVar8 = nnn;
              if (ppNVar4 == pNVar15->chars[iVar9].e) {
                iVar9 = toupper((uint)*reg);
                if (pNVar8->chars[iVar9].n < 3) {
                  pNVar14 = new_NFAState((LexState *)s_local);
                  pNVar15 = nnn;
                  a = (Action *)pNVar14;
                  iVar9 = toupper((uint)*reg);
                  pNVar8 = nnn;
                  ppNVar4 = pNVar15->chars[iVar9].v;
                  iVar9 = toupper((uint)*reg);
                  uVar2 = pNVar8->chars[iVar9].n;
                  pNVar8->chars[iVar9].n = uVar2 + 1;
                  ppNVar4[uVar2] = pNVar14;
                }
                else {
LAB_00145cff:
                  pNVar15 = nnn;
                  iVar9 = toupper((uint)*reg);
                  a = (Action *)new_NFAState((LexState *)s_local);
                  vec_add_internal(pNVar15->chars + iVar9,a);
                }
              }
              else {
                iVar9 = toupper((uint)*reg);
                if ((pNVar8->chars[iVar9].n & 7) == 0) goto LAB_00145cff;
                pNVar14 = new_NFAState((LexState *)s_local);
                pNVar15 = nnn;
                a = (Action *)pNVar14;
                iVar9 = toupper((uint)*reg);
                pNVar8 = nnn;
                ppNVar4 = pNVar15->chars[iVar9].v;
                iVar9 = toupper((uint)*reg);
                uVar2 = pNVar8->chars[iVar9].n;
                pNVar8->chars[iVar9].n = uVar2 + 1;
                ppNVar4[uVar2] = pNVar14;
              }
            }
            pNVar15 = nnn;
            iVar9 = tolower((uint)*reg);
            pNVar8 = nnn;
            pAVar7 = a;
            if (pNVar15->chars[iVar9].v == (NFAState **)0x0) {
              iVar9 = tolower((uint)*reg);
              pNVar15 = nnn;
              iVar10 = tolower((uint)*reg);
              pNVar14 = nnn;
              pNVar15->chars[iVar10].v = pNVar8->chars[iVar9].e;
              iVar10 = tolower((uint)*reg);
              uVar2 = pNVar14->chars[iVar10].n;
              pNVar14->chars[iVar10].n = uVar2 + 1;
              pNVar8->chars[iVar9].e[uVar2] = (NFAState *)pAVar7;
            }
            else {
              iVar9 = tolower((uint)*reg);
              pNVar15 = nnn;
              ppNVar4 = pNVar8->chars[iVar9].v;
              iVar9 = tolower((uint)*reg);
              pNVar8 = nnn;
              if (ppNVar4 == pNVar15->chars[iVar9].e) {
                iVar9 = tolower((uint)*reg);
                pNVar15 = nnn;
                pAVar7 = a;
                if (pNVar8->chars[iVar9].n < 3) {
                  iVar9 = tolower((uint)*reg);
                  pNVar8 = nnn;
                  ppNVar4 = pNVar15->chars[iVar9].v;
                  iVar9 = tolower((uint)*reg);
                  uVar2 = pNVar8->chars[iVar9].n;
                  pNVar8->chars[iVar9].n = uVar2 + 1;
                  ppNVar4[uVar2] = (NFAState *)pAVar7;
                }
                else {
LAB_0014607c:
                  pNVar15 = nnn;
                  iVar9 = tolower((uint)*reg);
                  vec_add_internal(pNVar15->chars + iVar9,a);
                }
              }
              else {
                iVar9 = tolower((uint)*reg);
                pNVar15 = nnn;
                pAVar7 = a;
                if ((pNVar8->chars[iVar9].n & 7) == 0) goto LAB_0014607c;
                iVar9 = tolower((uint)*reg);
                pNVar8 = nnn;
                ppNVar4 = pNVar15->chars[iVar9].v;
                iVar9 = tolower((uint)*reg);
                uVar2 = pNVar8->chars[iVar9].n;
                pNVar8->chars[iVar9].n = uVar2 + 1;
                ppNVar4[uVar2] = (NFAState *)pAVar7;
              }
            }
          }
          nnn = (NFAState *)a;
        }
      }
      if ((nnn->accepts).v == (Action **)0x0) {
        (nnn->accepts).v = (nnn->accepts).e;
        uVar2 = (nnn->accepts).n;
        (nnn->accepts).n = uVar2 + 1;
        (nnn->accepts).e[uVar2] = (Action *)c;
      }
      else if ((nnn->accepts).v == (nnn->accepts).e) {
        if ((nnn->accepts).n < 3) {
          uVar2 = (nnn->accepts).n;
          (nnn->accepts).n = uVar2 + 1;
          (nnn->accepts).v[uVar2] = (Action *)c;
        }
        else {
LAB_001463ae:
          vec_add_internal(&nnn->accepts,c);
        }
      }
      else {
        if (((nnn->accepts).n & 7) == 0) goto LAB_001463ae;
        uVar2 = (nnn->accepts).n;
        (nnn->accepts).n = uVar2 + 1;
        (nnn->accepts).v[uVar2] = (Action *)c;
      }
    }
  }
  trailing_context._4_4_ = 0;
  do {
    if (*(uint *)&n->chars[3].v <= trailing_context._4_4_) {
      if (bVar6) {
        nfa_to_scanner(nn,(Scanner *)&n->chars[7].v);
        compute_transitions((LexState *)s_local,(Scanner *)&n->chars[7].v);
      }
      free_VecNFAState((VecNFAState *)&s_local->hash);
      *(int *)((long)(s_local->items).e + 0x14) = *(int *)((long)(s_local->items).e + 0x14) + 1;
      return;
    }
    c = (uint8 *)n->chars[3].e[0]->chars[0].e[(ulong)trailing_context._4_4_ - 3];
    if ((((NFAState *)c)->index == 1) && (**(int **)((NFAState *)c)->chars == 1)) {
      pNVar15 = (NFAState *)malloc(0x30);
      memcpy(pNVar15,c,0x30);
      pNVar15->index = ACTION_SHIFT_TRAILING;
      uVar3 = *(uint *)((long)ls_local[0xe].allnfas.e + 4);
      *(uint *)((long)ls_local[0xe].allnfas.e + 4) = uVar3 + 1;
      *(uint *)(pNVar15->chars[0].e + 1) = uVar3;
      bVar6 = true;
      _one = *(uint8 **)(*(long *)(c + 8) + 0x20);
      if ((nn->epsilon).v == (NFAState **)0x0) {
        a = (Action *)new_NFAState((LexState *)s_local);
        (nn->epsilon).v = (nn->epsilon).e;
        uVar2 = (nn->epsilon).n;
        (nn->epsilon).n = uVar2 + 1;
        (nn->epsilon).e[uVar2] = (NFAState *)a;
      }
      else if ((nn->epsilon).v == (nn->epsilon).e) {
        if ((nn->epsilon).n < 3) {
          a = (Action *)new_NFAState((LexState *)s_local);
          uVar2 = (nn->epsilon).n;
          (nn->epsilon).n = uVar2 + 1;
          (nn->epsilon).v[uVar2] = (NFAState *)a;
        }
        else {
LAB_00146594:
          v = &nn->epsilon;
          a = (Action *)new_NFAState((LexState *)s_local);
          vec_add_internal(v,a);
        }
      }
      else {
        if (((nn->epsilon).n & 7) == 0) goto LAB_00146594;
        a = (Action *)new_NFAState((LexState *)s_local);
        uVar2 = (nn->epsilon).n;
        (nn->epsilon).n = uVar2 + 1;
        (nn->epsilon).v[uVar2] = (NFAState *)a;
      }
      nnn = new_NFAState((LexState *)s_local);
      (s_local->items_hash).n = (uint)(*(byte *)(*(long *)(c + 8) + 0x2c) >> 3 & 1);
      iVar9 = build_regex_nfa((LexState *)s_local,(uint8 **)&one,(NFAState *)a,nnn,(Action *)pNVar15
                             );
      if (iVar9 == 0) {
        free(pNVar15);
      }
      else {
        *(byte *)(*(long *)(c + 8) + 0x2c) = *(byte *)(*(long *)(c + 8) + 0x2c) & 0xef | 0x10;
        *(byte *)&n->chars[9].v = *(byte *)&n->chars[9].v & 0xbf | 0x40;
        lVar5._0_4_ = ls_local[2].allnfas.n;
        lVar5._4_4_ = ls_local[2].allnfas.i;
        if (lVar5 == 0) {
          *(NFAState ****)&ls_local[2].allnfas = &ls_local[2].allnfas.v;
          uVar2 = ls_local[2].nfa_index;
          ls_local[2].nfa_index = uVar2 + 1;
          ls_local[2].allnfas.e[(ulong)uVar2 - 1] = pNVar15;
        }
        else if ((NFAState ***)*(undefined1 **)&ls_local[2].allnfas == &ls_local[2].allnfas.v) {
          if (ls_local[2].nfa_index < 3) {
            uVar2 = ls_local[2].nfa_index;
            ls_local[2].nfa_index = uVar2 + 1;
            *(NFAState **)(*(long *)&ls_local[2].allnfas + (ulong)uVar2 * 8) = pNVar15;
          }
          else {
LAB_00146723:
            vec_add_internal(ls_local + 2,pNVar15);
          }
        }
        else {
          if ((ls_local[2].nfa_index & 7) == 0) goto LAB_00146723;
          uVar2 = ls_local[2].nfa_index;
          ls_local[2].nfa_index = uVar2 + 1;
          *(NFAState **)(*(long *)&ls_local[2].allnfas + (ulong)uVar2 * 8) = pNVar15;
        }
      }
      if ((nnn->accepts).v == (Action **)0x0) {
        (nnn->accepts).v = (nnn->accepts).e;
        uVar2 = (nnn->accepts).n;
        (nnn->accepts).n = uVar2 + 1;
        (nnn->accepts).e[uVar2] = (Action *)c;
      }
      else if ((nnn->accepts).v == (nnn->accepts).e) {
        if ((nnn->accepts).n < 3) {
          uVar2 = (nnn->accepts).n;
          (nnn->accepts).n = uVar2 + 1;
          (nnn->accepts).v[uVar2] = (Action *)c;
        }
        else {
LAB_00146833:
          vec_add_internal(&nnn->accepts,c);
        }
      }
      else {
        if (((nnn->accepts).n & 7) == 0) goto LAB_00146833;
        uVar2 = (nnn->accepts).n;
        (nnn->accepts).n = uVar2 + 1;
        (nnn->accepts).v[uVar2] = (Action *)c;
      }
    }
    trailing_context._4_4_ = trailing_context._4_4_ + 1;
  } while( true );
}

Assistant:

static void build_state_scanner(Grammar *g, LexState *ls, State *s) {
  NFAState *n, *nn, *nnn;
  Action *a;
  uint8 *c, *reg;
  uint j, one;

  one = 0;
  n = new_NFAState(ls);
  /* first strings since they can be trivially combined as a tree */
  for (j = 0; j < s->shift_actions.n; j++) {
    a = s->shift_actions.v[j];
    if (a->kind == ACTION_ACCEPT) {
      one = 1;
      if (!n->chars[0].n)
        vec_add(&n->chars[0], (nnn = new_NFAState(ls)));
      else
        nnn = n->chars[0].v[0];
      vec_add(&nnn->accepts, a);
    } else if (a->kind == ACTION_SHIFT && a->term->kind == TERM_STRING) {
      one = 1;
      nn = n;
      if (!a->term->ignore_case) {
        for (c = (uint8 *)a->term->string; *c; c++) {
          if (!nn->chars[*c].n)
            vec_add(&nn->chars[*c], (nnn = new_NFAState(ls)));
          else
            nnn = nn->chars[*c].v[0];
          nn = nnn;
        }
      } else { /* use new states */
        for (c = (uint8 *)a->term->string; *c; c++) {
          if (isalpha(*c)) {
            vec_add(&nn->chars[toupper(*c)], (nnn = new_NFAState(ls)));
            vec_add(&nn->chars[tolower(*c)], nnn);
          } else
            vec_add(&nn->chars[*c], (nnn = new_NFAState(ls)));
          nn = nnn;
        }
      }
      vec_add(&nn->accepts, a);
    }
  }
  /* now regexes */
  for (j = 0; j < s->shift_actions.n; j++) {
    a = s->shift_actions.v[j];
    if (a->kind == ACTION_SHIFT && a->term->kind == TERM_REGEX) {
      Action *trailing_context = (Action *)MALLOC(sizeof(Action));
      memcpy(trailing_context, a, sizeof(Action));
      trailing_context->kind = ACTION_SHIFT_TRAILING;
      trailing_context->index = g->action_count++;
      one = 1;
      reg = (uint8 *)a->term->string;
      vec_add(&n->epsilon, (nnn = new_NFAState(ls)));
      nn = new_NFAState(ls);
      ls->ignore_case = a->term->ignore_case;
      if (build_regex_nfa(ls, &reg, nnn, nn, trailing_context)) {
        a->term->trailing_context = 1;
        s->trailing_context = 1;
        vec_add(&g->actions, trailing_context);
      } else
        FREE(trailing_context);
      vec_add(&nn->accepts, a);
    }
  }
  if (one) {
    nfa_to_scanner(n, &s->scanner);
    compute_transitions(ls, &s->scanner);
  }
  free_VecNFAState(&ls->allnfas);
  ls->scanners++;
}